

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer-backend-egl.c
# Opt level: O2

wpe_renderer_backend_egl_target * wpe_renderer_backend_egl_target_create(int host_fd)

{
  wpe_renderer_backend_egl_target *__ptr;
  wpe_renderer_backend_egl_target_interface *pwVar1;
  void *pvVar2;
  uint in_ECX;
  char *in_RDX;
  
  __ptr = (wpe_renderer_backend_egl_target *)wpe_calloc_impl(0x20,0x4b,in_RDX,in_ECX);
  pwVar1 = (wpe_renderer_backend_egl_target_interface *)
           wpe_load_object("_wpe_renderer_backend_egl_target_interface");
  (__ptr->base).interface = pwVar1;
  if (pwVar1 == (wpe_renderer_backend_egl_target_interface *)0x0) {
    free(__ptr);
    __ptr = (wpe_renderer_backend_egl_target *)0x0;
  }
  else {
    pvVar2 = (*pwVar1->create)(__ptr,host_fd);
    (__ptr->base).interface_data = pvVar2;
  }
  return __ptr;
}

Assistant:

struct wpe_renderer_backend_egl_target*
wpe_renderer_backend_egl_target_create(int host_fd)
{
    struct wpe_renderer_backend_egl_target* target = wpe_calloc(1, sizeof(struct wpe_renderer_backend_egl_target));

    target->base.interface = wpe_load_object("_wpe_renderer_backend_egl_target_interface");
    if (!target->base.interface) {
        wpe_free(target);
        return 0;
    }

    target->base.interface_data = target->base.interface->create(target, host_fd);

    return target;
}